

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

int Of_ManPrepareCuts(Of_Cut_t *pCuts,Of_Man_t *p,int iObj,int fAddUnit)

{
  int *piVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint *puVar8;
  Of_Cut_t *pOVar9;
  
  if ((-1 < iObj) && (iObj < (p->vCutSets).nSize)) {
    uVar6 = (p->vCutSets).pArray[(uint)iObj];
    if ((int)uVar6 < 1) {
      pCuts->Delay = 0;
      pCuts->Flow = 0;
      *(undefined4 *)&pCuts->field_0x10 = 0x8000002;
      pCuts->pLeaves[0] = iObj;
      pCuts->Sign = 1L << ((byte)iObj & 0x3f);
      iVar3 = 1;
    }
    else {
      if ((p->vPages).nSize <= (int)(uVar6 >> 0x10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = (p->vPages).pArray[uVar6 >> 0x10];
      iVar3 = *(int *)((long)pvVar2 + (ulong)(uVar6 & 0xffff) * 4);
      pOVar9 = pCuts;
      if (0 < iVar3) {
        piVar1 = (int *)((long)pvVar2 + (ulong)(uVar6 & 0xffff) * 4);
        puVar8 = (uint *)(piVar1 + 1);
        iVar7 = 0;
        do {
          pOVar9->Delay = 0;
          pOVar9->Flow = 0;
          uVar6 = *puVar8;
          *(uint *)&pOVar9->field_0x10 = *(uint *)&pOVar9->field_0x10 & 0xf8000000 | uVar6 >> 5;
          *(uint *)&pOVar9->field_0x10 = *puVar8 << 0x1b | uVar6 >> 5;
          uVar6 = *puVar8 & 0x1f;
          if (uVar6 == 0) {
            uVar4 = 0;
          }
          else {
            uVar5 = 0;
            uVar4 = 0;
            do {
              uVar4 = uVar4 | 1L << ((ulong)(byte)(puVar8 + 1)[uVar5] & 0x3f);
              uVar5 = uVar5 + 1;
            } while (uVar6 != uVar5);
          }
          pOVar9->Sign = uVar4;
          memcpy(pOVar9->pLeaves,puVar8 + 1,(ulong)(uVar6 << 2));
          pOVar9 = pOVar9 + 1;
          iVar7 = iVar7 + 1;
          puVar8 = puVar8 + (ulong)(*puVar8 & 0x1f) + 4;
          iVar3 = *piVar1;
        } while (iVar7 < iVar3);
      }
      if ((fAddUnit != 0) && (0xfffffff < *(uint *)&pCuts->field_0x10)) {
        pOVar9->Delay = 0;
        pOVar9->Flow = 0;
        *(undefined4 *)&pOVar9->field_0x10 = 0x8000002;
        pOVar9->pLeaves[0] = iObj;
        pOVar9->Sign = 1L << ((byte)iObj & 0x3f);
        iVar3 = iVar3 + 1;
      }
    }
    return iVar3;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int Of_ManPrepareCuts( Of_Cut_t * pCuts, Of_Man_t * p, int iObj, int fAddUnit )
{
    if ( Of_ObjHasCuts(p, iObj) )
    {
        Of_Cut_t * pMfCut = pCuts;
        int i, * pCut, * pList = Of_ObjCutSet(p, iObj);
        Of_SetForEachCut( pList, pCut, i )
        {
            pMfCut->Delay   = 0;
            pMfCut->Flow    = 0;
            pMfCut->iFunc   = Of_CutFunc( pCut );
            pMfCut->nLeaves = Of_CutSize( pCut );
            pMfCut->Sign    = Of_CutGetSign( pCut+1, Of_CutSize(pCut) );
            memcpy( pMfCut->pLeaves, pCut+1, sizeof(int) * Of_CutSize(pCut) );
            pMfCut++;
        }
        if ( fAddUnit && pCuts->nLeaves > 1 )
            return pList[0] + Of_CutCreateUnit( pMfCut, iObj );
        return pList[0];
    }
    return Of_CutCreateUnit( pCuts, iObj );
}